

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O2

void __thiscall pktalloc::Allocator::Shrink(Allocator *this,uint8_t *ptr,uint bytes)

{
  uint uVar1;
  uint uVar2;
  CustomBitSet<2048U> *this_00;
  uint uVar3;
  uint bitStart;
  uint uVar4;
  
  if ((ptr != (uint8_t *)0x0) && (uVar2 = *(uint *)(ptr + -0x18), uVar2 != 0)) {
    uVar4 = bytes + 0x1f >> 5;
    uVar1 = uVar4 + 1;
    if (uVar1 < uVar2) {
      this_00 = *(CustomBitSet<2048U> **)(ptr + -0x20);
      if (this_00 != (CustomBitSet<2048U> *)0x0) {
        uVar3 = ((int)(ptr + -0x20) - (int)this_00) - 0x120U >> 5;
        bitStart = uVar3 + uVar1;
        if (bitStart < *(uint *)(this_00 + 0x104)) {
          *(uint *)(this_00 + 0x104) = bitStart;
        }
        CustomBitSet<2048U>::ClearRange(this_00,bitStart,uVar3 + uVar2);
        *(uint *)(this_00 + 0x100) = *(int *)(this_00 + 0x100) + ~uVar4 + uVar2;
        *(uint *)(ptr + -0x18) = uVar1;
      }
    }
  }
  return;
}

Assistant:

void Allocator::Shrink(uint8_t* ptr, unsigned bytes)
{
    ALLOC_DEBUG_INTEGRITY_CHECK();

    if (!ptr) {
        return;
    }
    PKTALLOC_DEBUG_ASSERT((uintptr_t)ptr % kUnitSize == 0);

    AllocationHeader* regionHeader = (AllocationHeader*)(ptr - kUnitSize);
#ifdef PKTALLOC_DEBUG
    if (regionHeader->Canary != AllocationHeader::kCanaryExpected) {
        PKTALLOC_DEBUG_BREAK(); // Buffer overflow detected
        return;
    }
#endif // PKTALLOC_DEBUG
    if (regionHeader->IsFreed()) {
        PKTALLOC_DEBUG_BREAK(); // Double-free
        return;
    }

    // Calculate number of units required by this allocation
    // Note: +1 for the AllocationHeader
    const unsigned unitsNeeded = (bytes + kUnitSize - 1) / kUnitSize + 1;
    const unsigned unitsCurrent = regionHeader->UsedUnits;

    // If the allocation can shrink:
    if (unitsNeeded < unitsCurrent)
    {
        WindowHeader* windowHeader = regionHeader->Header;
        if (!windowHeader) {
            // Fallback allocation: We cannot resize this region
            return;
        }

        PKTALLOC_DEBUG_ASSERT((uint8_t*)regionHeader >= (uint8_t*)regionHeader->Header + kWindowHeaderBytes);
        const unsigned regionStart = regionHeader->GetUnitStart();
        PKTALLOC_DEBUG_ASSERT(regionStart < kWindowMaxUnits);
        PKTALLOC_DEBUG_ASSERT(regionStart + regionHeader->UsedUnits <= kWindowMaxUnits);

        const unsigned regionEndNew = regionStart + unitsNeeded;
        PKTALLOC_DEBUG_ASSERT(regionEndNew <= kWindowMaxUnits);
        PKTALLOC_DEBUG_ASSERT((regionStart + unitsCurrent) > regionEndNew);

        // Resume scanning from this hole next time
        if (windowHeader->ResumeScanOffset > regionEndNew) {
            windowHeader->ResumeScanOffset = regionEndNew;
        }

        // Clear the units we gave up
        windowHeader->Used.ClearRange(regionEndNew, regionStart + unitsCurrent);

        // Give back the unit count
        windowHeader->FreeUnitCount += unitsCurrent - unitsNeeded;

        // Update unit count
        regionHeader->UsedUnits = unitsNeeded;

        // Note that this will not move a full window to the empty list,
        // but when this allocation is freed it may be added later.
    }

    ALLOC_DEBUG_INTEGRITY_CHECK();
}